

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O2

void cjson_minify_should_not_overflow_buffer(void)

{
  long lVar1;
  long in_FS_OFFSET;
  char pending_escape [3];
  char unclosed_multiline_comment [7];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  builtin_strncpy(unclosed_multiline_comment,"/* bla",7);
  pending_escape[2] = '\0';
  pending_escape[0] = '\"';
  pending_escape[1] = '\\';
  cJSON_Minify(unclosed_multiline_comment);
  UnityAssertEqualString("",unclosed_multiline_comment,(char *)0x0,0x26);
  cJSON_Minify(pending_escape);
  UnityAssertEqualString("\"\\",pending_escape,(char *)0x0,0x29);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_minify_should_not_overflow_buffer(void)
{
    char unclosed_multiline_comment[] = "/* bla";
    char pending_escape[] = "\"\\";

    cJSON_Minify(unclosed_multiline_comment);
    TEST_ASSERT_EQUAL_STRING("", unclosed_multiline_comment);

    cJSON_Minify(pending_escape);
    TEST_ASSERT_EQUAL_STRING("\"\\", pending_escape);
}